

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket_acceptor.hpp
# Opt level: O0

int __thiscall
webfront::http::std::experimental::net::v1::
basic_socket_acceptor<std::experimental::net::v1::ip::tcp>::listen
          (basic_socket_acceptor<std::experimental::net::v1::ip::tcp> *this,int __fd,int __n)

{
  int extraout_EAX;
  service_type *psVar1;
  implementation_type *piVar2;
  error_code ec;
  char *in_stack_ffffffffffffffb8;
  
  error_code::error_code((error_code *)this);
  psVar1 = basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
           ::get_service(&this->
                          super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
                        );
  piVar2 = basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
           ::get_implementation
                     (&this->
                       super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
                     );
  detail::reactive_socket_service_base::listen
            (&psVar1->super_reactive_socket_service_base,(int)piVar2,__fd);
  detail::throw_error((error_code *)this,in_stack_ffffffffffffffb8);
  return extraout_EAX;
}

Assistant:

void listen(int backlog = socket_base::max_listen_connections)
  {
    std::error_code ec;
    this->get_service().listen(this->get_implementation(), backlog, ec);
    std::experimental::net::v1::detail::throw_error(ec, "listen");
  }